

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

function __thiscall
pybind11::get_type_overload(pybind11 *this,void *this_ptr,type_info *this_type,char *name)

{
  handle hVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  handle hVar5;
  internals *piVar6;
  iterator iVar7;
  handle hVar8;
  long lVar9;
  PyObject *pPVar10;
  __hashtable *__h;
  unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
  *this_00;
  __node_gen_type __node_gen;
  object local_60;
  handle local_58;
  undefined1 local_50 [32];
  
  hVar5 = detail::get_object_handle(this_ptr,this_type);
  if (hVar5.m_ptr == (PyObject *)0x0) {
LAB_0014c7d0:
    *(undefined8 *)this = 0;
    return (object)(object)this;
  }
  hVar1.m_ptr = (PyObject *)(hVar5.m_ptr)->ob_type;
  piVar6 = detail::get_internals();
  this_00 = &piVar6->inactive_overload_cache;
  local_50._0_8_ = hVar1.m_ptr;
  local_50._8_8_ = name;
  iVar7 = std::
          _Hashtable<std::pair<const__object_*,_const_char_*>,_std::pair<const__object_*,_const_char_*>,_std::allocator<std::pair<const__object_*,_const_char_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_pybind11::detail::overload_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)local_50);
  if (iVar7.super__Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true>._M_cur !=
      (__node_type *)0x0) goto LAB_0014c7d0;
  local_60.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_58.m_ptr = (PyObject *)PyObject_GetAttrString(hVar5.m_ptr,name);
  if (local_58.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
  }
  local_50._0_8_ = (PyObject *)0x0;
  object::~object((object *)local_50);
  object::~object(&local_60);
  hVar8 = function::cpp_function((function *)&local_58);
  if (hVar8.m_ptr == (PyObject *)0x0) {
    lVar9 = PyThreadState_Get();
    lVar9 = *(long *)(lVar9 + 0x18);
    if (lVar9 != 0) {
      local_60.super_handle.m_ptr =
           (handle)PyObject_Str(*(undefined8 *)(*(long *)(lVar9 + 0x20) + 0x70));
      str::operator_cast_to_string((string *)local_50,(str *)&local_60);
      iVar4 = std::__cxx11::string::compare(local_50);
      if (iVar4 == 0) {
        bVar3 = 0 < *(int *)(*(long *)(lVar9 + 0x20) + 0x10);
      }
      else {
        bVar3 = false;
      }
      if ((PyTypeObject *)local_50._0_8_ != (PyTypeObject *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
      object::~object(&local_60);
      if (bVar3) {
        PyFrame_FastToLocals(lVar9);
        lVar2 = *(long *)(*(long *)(lVar9 + 0x20) + 0x48);
        if ((*(byte *)(*(long *)(lVar2 + 8) + 0xab) & 4) == 0) {
          __assert_fail("PyTuple_Check(frame->f_code->co_varnames)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/pybind11.h"
                        ,0x7ea,
                        "function pybind11::get_type_overload(const void *, const detail::type_info *, const char *)"
                       );
        }
        pPVar10 = (PyObject *)
                  PyDict_GetItem(*(undefined8 *)(lVar9 + 0x38),*(undefined8 *)(lVar2 + 0x18));
        if (pPVar10 == hVar5.m_ptr) goto LAB_0014c84c;
      }
    }
    *(PyObject **)this = local_58.m_ptr;
    local_58.m_ptr = (PyObject *)0x0;
  }
  else {
    local_60.super_handle.m_ptr = (handle)(handle)this_00;
    local_50._0_8_ = hVar1.m_ptr;
    local_50._8_8_ = name;
    std::
    _Hashtable<std::pair<_object_const*,char_const*>,std::pair<_object_const*,char_const*>,std::allocator<std::pair<_object_const*,char_const*>>,std::__detail::_Identity,std::equal_to<std::pair<_object_const*,char_const*>>,pybind11::detail::overload_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::pair<_object_const*,char_const*>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<_object_const*,char_const*>,true>>>>
              ((_Hashtable<std::pair<_object_const*,char_const*>,std::pair<_object_const*,char_const*>,std::allocator<std::pair<_object_const*,char_const*>>,std::__detail::_Identity,std::equal_to<std::pair<_object_const*,char_const*>>,pybind11::detail::overload_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00);
LAB_0014c84c:
    *(undefined8 *)this = 0;
  }
  object::~object((object *)&local_58);
  return (object)(object)this;
}

Assistant:

inline function get_type_overload(const void *this_ptr, const detail::type_info *this_type, const char *name)  {
    handle self = detail::get_object_handle(this_ptr, this_type);
    if (!self)
        return function();
    handle type = self.get_type();
    auto key = std::make_pair(type.ptr(), name);

    /* Cache functions that aren't overloaded in Python to avoid
       many costly Python dictionary lookups below */
    auto &cache = detail::get_internals().inactive_overload_cache;
    if (cache.find(key) != cache.end())
        return function();

    function overload = getattr(self, name, function());
    if (overload.is_cpp_function()) {
        cache.insert(key);
        return function();
    }

    /* Don't call dispatch code if invoked from overridden function.
       Unfortunately this doesn't work on PyPy. */
#if !defined(PYPY_VERSION)
    PyFrameObject *frame = PyThreadState_Get()->frame;
    if (frame && (std::string) str(frame->f_code->co_name) == name &&
        frame->f_code->co_argcount > 0) {
        PyFrame_FastToLocals(frame);
        PyObject *self_caller = PyDict_GetItem(
            frame->f_locals, PyTuple_GET_ITEM(frame->f_code->co_varnames, 0));
        if (self_caller == self.ptr())
            return function();
    }
#else
    /* PyPy currently doesn't provide a detailed cpyext emulation of
       frame objects, so we have to emulate this using Python. This
       is going to be slow..*/
    dict d; d["self"] = self; d["name"] = pybind11::str(name);
    PyObject *result = PyRun_String(
        "import inspect\n"
        "frame = inspect.currentframe()\n"
        "if frame is not None:\n"
        "    frame = frame.f_back\n"
        "    if frame is not None and str(frame.f_code.co_name) == name and "
        "frame.f_code.co_argcount > 0:\n"
        "        self_caller = frame.f_locals[frame.f_code.co_varnames[0]]\n"
        "        if self_caller == self:\n"
        "            self = None\n",
        Py_file_input, d.ptr(), d.ptr());
    if (result == nullptr)
        throw error_already_set();
    if (d["self"].is_none())
        return function();
    Py_DECREF(result);
#endif

    return overload;
}